

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  size_t sVar1;
  int in_ECX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ostream *poVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  char *pcVar5;
  String SVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  size_t sVar2;
  
  Message::Message((Message *)&local_48);
  internal::FormatFileLocation_abi_cxx11_
            (&local_40,(internal *)(test_part_result->file_name_).c_str_,
             (char *)(ulong)(uint)test_part_result->line_number_,in_ECX);
  poVar3 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar3 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_40._M_dataplus._M_p,local_40._M_string_length);
  poVar3 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar3 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if ((ulong)test_part_result->type_ < 3) {
    pcVar5 = &DAT_001d0ab0 + *(int *)(&DAT_001d0ab0 + (ulong)test_part_result->type_ * 4);
  }
  else {
    pcVar5 = "Unknown result type";
  }
  poVar3 = (ostream *)(local_48.ptr_ + 0x10);
  if (local_48.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar3 = (ostream *)0x0;
  }
  sVar1 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,sVar1);
  pcVar5 = (test_part_result->message_).c_str_;
  if (pcVar5 == (char *)0x0) {
    sVar4.ptr_ = local_48.ptr_ + 0x10;
    sVar1 = 6;
    pcVar5 = "(null)";
  }
  else {
    sVar4.ptr_ = local_48.ptr_;
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_48.ptr_ + 0x10);
    }
    sVar1 = strlen(pcVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar4.ptr_,pcVar5,sVar1);
  SVar6 = internal::StringStreamToString((internal *)this,local_48.ptr_);
  sVar2 = SVar6.length_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX;
  }
  if (local_48.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_48.ptr_ + 8))();
    sVar2 = extraout_RDX_00;
  }
  SVar6.length_ = sVar2;
  SVar6.c_str_ = (char *)this;
  return SVar6;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}